

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::SetRange
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  char16 cVar4;
  int iVar5;
  undefined4 *puVar6;
  char16 partialHigher;
  char16 partialLower;
  int upperIndex;
  int lowerIndex;
  Char hc_local;
  Char lc_local;
  ArenaAllocator *allocator_local;
  CharSet<unsigned_int> *this_local;
  
  if (hc < lc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x623,"(lc <= hc)","lc <= hc");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  _partialHigher = CharToIndex(this,lc);
  iVar5 = CharToIndex(this,hc);
  if (_partialHigher == iVar5) {
    cVar3 = RemoveOffset(this,lc);
    cVar4 = RemoveOffset(this,hc);
    CharSet<char16_t>::SetRange(this->characterPlanes + _partialHigher,allocator,cVar3,cVar4);
  }
  else {
    cVar3 = RemoveOffset(this,lc);
    cVar4 = RemoveOffset(this,hc);
    if (cVar3 != L'\0') {
      CharSet<char16_t>::SetRange(this->characterPlanes + _partialHigher,allocator,cVar3,L'\xffff');
      _partialHigher = _partialHigher + 1;
    }
    for (; _partialHigher < iVar5; _partialHigher = _partialHigher + 1) {
      CharSet<char16_t>::SetRange(this->characterPlanes + _partialHigher,allocator,L'\0',L'\xffff');
    }
    CharSet<char16_t>::SetRange(this->characterPlanes + iVar5,allocator,L'\0',cVar4);
  }
  return;
}

Assistant:

void CharSet<codepoint_t>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        Assert(lc <= hc);

        int lowerIndex = this->CharToIndex(lc);
        int upperIndex = this->CharToIndex(hc);

        if (lowerIndex == upperIndex)
        {
            this->characterPlanes[lowerIndex].SetRange(allocator, this->RemoveOffset(lc), this->RemoveOffset(hc));
        }
        else
        {
            // Do the partial ranges
            char16 partialLower = this->RemoveOffset(lc);
            char16 partialHigher = this->RemoveOffset(hc);

            if (partialLower != 0)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, partialLower, Chars<char16>::MaxUChar);
                lowerIndex++;
            }

            for(; lowerIndex < upperIndex; lowerIndex++)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, 0, Chars<char16>::MaxUChar);
            }

            this->characterPlanes[upperIndex].SetRange(allocator, 0, partialHigher);
        }
    }